

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O0

void __thiscall UDPRelay::HandleEvent(UDPRelay *this,SOCKET s,int event)

{
  Log *pLVar1;
  bool local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Self local_58;
  _Self local_50 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint local_18;
  SOCKET local_14;
  int event_local;
  SOCKET s_local;
  UDPRelay *this_local;
  
  local_18 = event;
  local_14 = s;
  _event_local = this;
  if (s == this->server_socket_) {
    if ((event & 8U) != 0) {
      pLVar1 = Log::GetInstance();
      pLVar1 = Log::operator<<(pLVar1,white);
      Log::FormatTime_abi_cxx11_();
      pLVar1 = Log::operator<<(pLVar1,&local_38);
      pLVar1 = Log::operator<<(pLVar1,(char (*) [9])" [info] ");
      Log::operator<<(pLVar1,(char (*) [22])"UDP server_socket err");
      std::__cxx11::string::~string((string *)&local_38);
    }
    HandleServer(this);
  }
  else {
    local_a1 = false;
    if (s != -1) {
      local_50[0]._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->sockets_,&local_14);
      local_58._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->sockets_);
      local_a1 = std::operator!=(local_50,&local_58);
    }
    if (local_a1 != false) {
      if ((local_18 & 8) != 0) {
        pLVar1 = Log::GetInstance();
        pLVar1 = Log::operator<<(pLVar1,white);
        Log::FormatTime_abi_cxx11_();
        pLVar1 = Log::operator<<(pLVar1,&local_78);
        pLVar1 = Log::operator<<(pLVar1,(char (*) [9])" [info] ");
        Log::operator<<(pLVar1,(char (*) [22])"UDP client_socket err");
        std::__cxx11::string::~string((string *)&local_78);
      }
      HandleClient(this,local_14);
    }
  }
  return;
}

Assistant:

void UDPRelay::HandleEvent(SOCKET s, int event)
{
    if (s == server_socket_)
    {
        if (event & kPollErr)
        {
            LOGI << "UDP server_socket err";
        }
        HandleServer();
    }
    else if(s != INVALID_SOCKET &&
            sockets_.find(s) != sockets_.end())
    {
        if (event & kPollErr)
        {
            LOGI << "UDP client_socket err";
        }
        HandleClient(s);
    }
}